

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

void icetImageCopyColorf(IceTImage image,IceTFloat *color_buffer,IceTEnum out_color_format)

{
  IceTEnum IVar1;
  IceTSizeType IVar2;
  IceTSizeType IVar3;
  IceTFloat *__src;
  IceTFloat *local_50;
  IceTFloat *out;
  IceTUByte *in;
  IceTSizeType i;
  IceTSizeType num_pixels;
  IceTUByte *in_buffer_1;
  IceTSizeType color_format_bytes;
  IceTFloat *in_buffer;
  IceTEnum in_color_format;
  IceTEnum out_color_format_local;
  IceTFloat *color_buffer_local;
  IceTImage image_local;
  
  IVar1 = icetImageGetColorFormat(image);
  if (out_color_format == 0xc002) {
    if (IVar1 == 0xc000) {
      icetRaiseDiagnostic("Input image has no color data.",0xfffffffb,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                          ,0x324);
    }
    else if (IVar1 == 0xc002) {
      __src = icetImageGetColorcf(image);
      IVar2 = icetImageGetNumPixels(image);
      IVar3 = colorPixelSize(0xc002);
      memcpy(color_buffer,__src,(long)(IVar2 * IVar3));
    }
    else if (IVar1 == 0xc001) {
      out = (IceTFloat *)icetImageGetColorcub(image);
      IVar2 = icetImageGetNumPixels(image);
      local_50 = color_buffer;
      for (in._0_4_ = 0; (int)in < IVar2 * 4; in._0_4_ = (int)in + 1) {
        *local_50 = (IceTFloat)((float)*(byte *)out / 255.0);
        out = (IceTFloat *)((long)out + 1);
        local_50 = local_50 + 1;
      }
    }
    else {
      icetRaiseDiagnostic("Unexpected format combination.",0xffffffff,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                          ,0x33a);
    }
  }
  else {
    icetRaiseDiagnostic("Color format is not of type float.",0xfffffffe,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                        ,799);
  }
  return;
}

Assistant:

void icetImageCopyColorf(const IceTImage image,
                         IceTFloat *color_buffer,
                         IceTEnum out_color_format)
{
    IceTEnum in_color_format = icetImageGetColorFormat(image);

    if (out_color_format != ICET_IMAGE_COLOR_RGBA_FLOAT) {
        icetRaiseError("Color format is not of type float.",
                       ICET_INVALID_ENUM);
        return;
    }
    if (in_color_format == ICET_IMAGE_COLOR_NONE) {
        icetRaiseError("Input image has no color data.",
                       ICET_INVALID_OPERATION);
        return;
    }

    if (in_color_format == out_color_format) {
        const IceTFloat *in_buffer = icetImageGetColorcf(image);
        IceTSizeType color_format_bytes = (  icetImageGetNumPixels(image)
                                           * colorPixelSize(in_color_format) );
        memcpy(color_buffer, in_buffer, color_format_bytes);
    } else if (   (in_color_format == ICET_IMAGE_COLOR_RGBA_UBYTE)
               && (out_color_format == ICET_IMAGE_COLOR_RGBA_FLOAT) ) {
        const IceTUByte *in_buffer = icetImageGetColorcub(image);
        IceTSizeType num_pixels = icetImageGetNumPixels(image);
        IceTSizeType i;
        const IceTUByte *in;
        IceTFloat *out;
        for (i = 0, in = in_buffer, out = color_buffer; i < 4*num_pixels;
             i++, in++, out++) {
            out[0] = (IceTFloat)in[0]/255.0f;
        }
    } else {
        icetRaiseError("Unexpected format combination.",
                       ICET_SANITY_CHECK_FAIL);
    }
}